

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLMaterialLoader.cpp
# Opt level: O1

void __thiscall
Assimp::MDLImporter::SkipSkinLump_3DGS_MDL7
          (MDLImporter *this,uchar *szCurrent,uchar **szCurrentOut,uint iType,uint iWidth,
          uint iHeight)

{
  size_t sVar1;
  int *piVar2;
  ulong uVar3;
  int *szData;
  uint iType_00;
  uint iSkip;
  aiTexture tex;
  uint local_468;
  uint local_464;
  uchar **local_460;
  aiTexture local_458;
  
  iType_00 = iType & 0xf;
  uVar3 = 0;
  if (iType_00 == 6) {
    uVar3 = (ulong)iWidth;
  }
  szData = (int *)(szCurrent + uVar3);
  if (iType_00 == 7) {
    sVar1 = strlen((char *)szData);
    szData = (int *)((long)szData + sVar1 + 1);
  }
  else if (iType == 0 || iType_00 != 0) {
    local_468 = 0;
    local_458.mWidth = 0;
    local_458.mHeight = 0;
    local_458.pcData = (aiTexel *)0x0;
    local_458.mFilename.length = 0;
    local_458.mFilename.data[0] = '\0';
    local_464 = iHeight;
    local_460 = szCurrentOut;
    memset(local_458.mFilename.data + 1,0x1b,0x3ff);
    local_458.achFormatHint[0] = '\0';
    local_458.achFormatHint[1] = '\0';
    local_458.achFormatHint[2] = '\0';
    local_458.achFormatHint[3] = '\0';
    local_458.pcData = (aiTexel *)0xffffffffffffffff;
    local_458.mHeight = local_464;
    local_458.mWidth = iWidth;
    ParseTextureColorData(this,(uchar *)szData,iType_00,&local_468,&local_458);
    szData = (int *)((long)szData + (ulong)local_468);
    szCurrentOut = local_460;
  }
  piVar2 = szData + 0x11;
  if ((iType & 0x10) == 0) {
    piVar2 = szData;
  }
  if ((iType & 0x20) != 0) {
    piVar2 = (int *)((long)piVar2 + (long)*piVar2 + 4);
  }
  *szCurrentOut = (uchar *)piVar2;
  return;
}

Assistant:

void MDLImporter::SkipSkinLump_3DGS_MDL7(
    const unsigned char* szCurrent,
    const unsigned char** szCurrentOut,
    unsigned int iType,
    unsigned int iWidth,
    unsigned int iHeight)
{
    // get the type of the skin
    const unsigned int iMasked = (unsigned int)(iType & 0xF);

    if (0x6 == iMasked)
    {
        szCurrent += iWidth;
    }
    if (0x7 == iMasked)
    {
        const size_t iLen = ::strlen((const char*)szCurrent);
        szCurrent += iLen+1;
    }
    else if (iMasked || !iType)
    {
        if (iMasked || !iType || (iType && iWidth && iHeight))
        {
            // ParseTextureColorData(..., aiTexture::pcData == bad_texel) will simply
            // return the size of the color data in bytes in iSkip
            unsigned int iSkip = 0;

            aiTexture tex;
            tex.pcData = bad_texel;
            tex.mHeight = iHeight;
            tex.mWidth = iWidth;
            ParseTextureColorData(szCurrent,iMasked,&iSkip,&tex);

            // FIX: Important, otherwise the destructor will crash
            tex.pcData = NULL;

            // skip length of texture data
            szCurrent += iSkip;
        }
    }

    // check whether a material definition is contained in the skin
    if (iType & AI_MDL7_SKINTYPE_MATERIAL)
    {
        BE_NCONST MDL::Material_MDL7* pcMatIn = (BE_NCONST MDL::Material_MDL7*)szCurrent;
        szCurrent = (unsigned char*)(pcMatIn+1);
    }

    // if an ASCII effect description (HLSL?) is contained in the file,
    // we can simply ignore it ...
    if (iType & AI_MDL7_SKINTYPE_MATERIAL_ASCDEF)
    {
        int32_t iMe = *((int32_t*)szCurrent);
        AI_SWAP4(iMe);
        szCurrent += sizeof(char) * iMe + sizeof(int32_t);
    }
    *szCurrentOut = szCurrent;
}